

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall QMarkdownTextEdit::updateLineNumAreaGeometry(QMarkdownTextEdit *this)

{
  bool bVar1;
  int aleft;
  int atop;
  int awidth;
  int aheight;
  QRect *pQVar2;
  undefined1 local_48 [8];
  QRect oldGeometry;
  undefined1 local_30 [8];
  QRect newGeometry;
  QRect contentsRect;
  QMarkdownTextEdit *this_local;
  
  newGeometry._8_8_ = QWidget::contentsRect();
  aleft = QRect::left((QRect *)&newGeometry.x2);
  atop = QRect::top((QRect *)&newGeometry.x2);
  oldGeometry._8_8_ = LineNumArea::sizeHint(this->_lineNumArea);
  awidth = QSize::width((QSize *)&oldGeometry.x2);
  aheight = QRect::height((QRect *)&newGeometry.x2);
  QRect::QRect((QRect *)local_30,aleft,atop,awidth,aheight);
  pQVar2 = QWidget::geometry(&this->_lineNumArea->super_QWidget);
  local_48._0_4_ = pQVar2->x1;
  local_48._4_4_ = pQVar2->y1;
  oldGeometry.x1 = pQVar2->x2;
  oldGeometry.y1 = pQVar2->y2;
  bVar1 = ::operator!=((QRect *)local_30,(QRect *)local_48);
  if (bVar1) {
    QWidget::setGeometry((QRect *)this->_lineNumArea);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumAreaGeometry()
{
    const auto contentsRect = this->contentsRect();
    const QRect newGeometry = {contentsRect.left(), contentsRect.top(),
                               _lineNumArea->sizeHint().width(), contentsRect.height()};
    auto oldGeometry = _lineNumArea->geometry();
    if (newGeometry != oldGeometry) {
        _lineNumArea->setGeometry(newGeometry);
    }
}